

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_math.c
# Opt level: O0

double p2sc_round(double v,int d)

{
  int in_EDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double f;
  double i;
  int p;
  int power;
  double local_20;
  int local_18;
  int local_14;
  double local_10;
  double local_8;
  
  local_14 = in_EDI;
  local_10 = in_XMM0_Qa;
  dVar1 = modf(in_XMM0_Qa,&local_20);
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar2 = log10(local_10);
    dVar2 = floor(dVar2);
    local_18 = (int)(14.0 - dVar2);
    if (local_14 < local_18) {
      power = (int)((ulong)dVar1 >> 0x20);
      dVar2 = ipow10(power);
      dVar1 = round(dVar1 * dVar2);
      dVar2 = ipow10(power);
      dVar1 = round(dVar1 / dVar2);
      dVar2 = ipow10(power);
      local_8 = local_20 + dVar1 / dVar2;
    }
    else {
      local_8 = local_10;
    }
  }
  else {
    local_8 = local_10;
  }
  return local_8;
}

Assistant:

double p2sc_round(double v, int d) {
    int p;
    double i, f = modf(v, &i);

    if (!f)
        return v;

    /* idea from http://wiki.php.net/rfc/rounding */
    p = 14 - floor(log10(v));
    if (d >= p)
        return v;

    f = round(f * ipow10(p));
    f = round(f / ipow10(p - d));

    return i + f / ipow10(d);
}